

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O3

int __thiscall fmt::v7::detail::anon_func::dispatcher::run(dispatcher *this)

{
  char **ppcVar1;
  char *__s;
  char *pcVar2;
  size_t sVar3;
  
  pcVar2 = strerror_r(this->error_code_,*this->buffer_,this->buffer_size_);
  ppcVar1 = this->buffer_;
  __s = *ppcVar1;
  if ((__s == pcVar2) && (sVar3 = strlen(__s), sVar3 == this->buffer_size_ - 1)) {
    return 0x22;
  }
  *ppcVar1 = pcVar2;
  return 0;
}

Assistant:

int run() { return handle(strerror_r(error_code_, buffer_, buffer_size_)); }